

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::meshcoarsening(tetgenmesh *this)

{
  int iVar1;
  int iVar2;
  arraypool *remptlist;
  tetgenbehavior *ptVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  long local_38;
  
  if (this->b->quiet == 0) {
    puts("Mesh coarsening ...");
  }
  remptlist = (arraypool *)operator_new(0x30);
  remptlist->objectbytes = 8;
  remptlist->objectsperblock = 0x400;
  remptlist->log2objectsperblock = 10;
  remptlist->objectsperblockmark = 0x3ff;
  remptlist->toparraylen = 0;
  remptlist->toparray = (char **)0x0;
  remptlist->objects = 0;
  remptlist->totalmemory = 0;
  collectremovepoints(this,remptlist);
  local_38 = remptlist->objects;
  if (local_38 != 0) {
    ptVar3 = this->b;
    if ((0 < local_38) && (ptVar3->verbose != 0)) {
      printf("  Removing %ld points...\n",local_38);
      local_38 = remptlist->objects;
      ptVar3 = this->b;
    }
    iVar1 = ptVar3->fliplinklevel;
    ptVar3->fliplinklevel = -1;
    uVar4 = 1;
    uVar9 = 0xffffffff;
    iVar8 = 0;
    while( true ) {
      this->autofliplinklevel = uVar4;
      if (1 < ptVar3->verbose) {
        pcVar7 = "auto";
        if (0 < (int)uVar9) {
          pcVar7 = "fixed";
          uVar4 = uVar9;
        }
        printf("    Removing points [%s level = %2d] #:  %ld.\n",pcVar7,(ulong)uVar4);
      }
      for (uVar9 = 0; lVar6 = remptlist->objects, (int)uVar9 < lVar6; uVar9 = uVar9 + 1) {
        pcVar7 = remptlist->toparray[(int)uVar9 >> ((byte)remptlist->log2objectsperblock & 0x1f)];
        lVar6 = (long)remptlist->objectbytes * (long)(int)(remptlist->objectsperblockmark & uVar9);
        iVar2 = removevertexbyflips(this,*(point *)(pcVar7 + lVar6));
        if (iVar2 != 0) {
          uVar5 = remptlist->objects - 1;
          *(undefined8 *)(pcVar7 + lVar6) =
               *(undefined8 *)
                (remptlist->toparray[(long)uVar5 >> ((byte)remptlist->log2objectsperblock & 0x3f)] +
                (long)remptlist->objectbytes * ((long)remptlist->objectsperblockmark & uVar5));
          remptlist->objects = uVar5;
          uVar9 = uVar9 - 1;
        }
      }
      if (lVar6 < 1) goto LAB_00140b69;
      ptVar3 = this->b;
      uVar9 = ptVar3->fliplinklevel;
      if (-1 < (int)uVar9) break;
      if (lVar6 == local_38) {
        iVar2 = iVar8 + 1;
        if (1 < iVar8) {
          ptVar3->fliplinklevel = 100000;
          uVar9 = 100000;
        }
      }
      else {
        iVar2 = iVar8 - (uint)(0 < iVar8);
        local_38 = lVar6;
      }
      uVar4 = this->autofliplinklevel + ptVar3->fliplinklevelinc;
      iVar8 = iVar2;
    }
    if (ptVar3->verbose != 0) {
      printf("  %ld points are not removed !\n",lVar6);
    }
LAB_00140b69:
    this->b->fliplinklevel = iVar1;
  }
  arraypool::~arraypool(remptlist);
  operator_delete(remptlist,0x30);
  return;
}

Assistant:

void tetgenmesh::meshcoarsening()
{
  arraypool *remptlist;

  if (!b->quiet) {
    printf("Mesh coarsening ...\n");
  }

  // Collect the set of points to be removed
  remptlist = new arraypool(sizeof(point *), 10);
  collectremovepoints(remptlist);

  if (remptlist->objects == 0l) {
    delete remptlist;
    return;
  }

  if (b->verbose) {
    if (remptlist->objects > 0l) {
      printf("  Removing %ld points...\n", remptlist->objects);
    }
  }

  point *parypt, *plastpt;
  long ms = remptlist->objects;
  int nit = 0; 
  int bak_fliplinklevel = b->fliplinklevel;
  b->fliplinklevel = -1;
  autofliplinklevel = 1; // Init value.
  int i;

  while (1) {
  
    if (b->verbose > 1) {
      printf("    Removing points [%s level = %2d] #:  %ld.\n", 
             (b->fliplinklevel > 0) ? "fixed" : "auto",
             (b->fliplinklevel > 0) ? b->fliplinklevel : autofliplinklevel,
             remptlist->objects);
    }

    // Remove the list of points.
    for (i = 0; i < remptlist->objects; i++) {
      parypt = (point *) fastlookup(remptlist, i);
      if (removevertexbyflips(*parypt)) {
        // Move the last entry to the current place.
        plastpt = (point *) fastlookup(remptlist, remptlist->objects - 1);
        *parypt = *plastpt;
        remptlist->objects--;
        i--;
      }
    }

    if (remptlist->objects > 0l) {
      if (b->fliplinklevel >= 0) {
        break; // We have tried all levels.
      }
      if (remptlist->objects == ms) {
        nit++;
        if (nit >= 3) {
          // Do the last round with unbounded flip link level.
          b->fliplinklevel = 100000;
        }
      } else {
        ms = remptlist->objects;
        if (nit > 0) {
          nit--;
        }
      }
      autofliplinklevel+=b->fliplinklevelinc;
    } else {
      // All points are removed.
      break;
    }
  } // while (1)

  if (remptlist->objects > 0l) {
    if (b->verbose) {
      printf("  %ld points are not removed !\n", remptlist->objects);
    }
  }

  b->fliplinklevel = bak_fliplinklevel;
  delete remptlist;
}